

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

ssize_t __thiscall CTcDataStream::write(CTcDataStream *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  void *__n_00;
  void *__src;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar1 = (void *)this->rem_;
  if (pvVar1 < __buf) {
    do {
      if (pvVar1 == (void *)0x0) {
        alloc_page(this);
        pvVar1 = (void *)this->rem_;
      }
      __n_00 = pvVar1;
      if (__buf < pvVar1) {
        __n_00 = __buf;
      }
      memcpy(this->wp_,__src,(size_t)__n_00);
      this->ofs_ = this->ofs_ + (long)__n_00;
      this->wp_ = this->wp_ + (long)__n_00;
      pvVar1 = (void *)(this->rem_ - (long)__n_00);
      this->rem_ = (size_t)pvVar1;
      __src = (void *)((long)__src + (long)__n_00);
      __buf = (void *)((long)__buf - (long)__n_00);
    } while (__buf != (void *)0x0);
  }
  else {
    pvVar1 = memcpy(this->wp_,__src,(size_t)__buf);
    this->ofs_ = this->ofs_ + (long)__buf;
    this->wp_ = this->wp_ + (long)__buf;
    this->rem_ = this->rem_ - (long)__buf;
  }
  return (ssize_t)pvVar1;
}

Assistant:

void CTcDataStream::write(const char *buf, size_t len)
{
    /* 
     *   if possible, write it in one go (this is for efficiency, so that
     *   we can avoid making a few comparisons in the most common case) 
     */
    if (len <= rem_)
    {
        /* write the data */
        memcpy(wp_, buf, len);

        /* advance the output pointers */
        ofs_ += len;
        wp_ += len;
        rem_ -= len;
    }
    else
    {
        /* keep going until we satisfy the request */
        do
        {
            size_t cur;

            /* if necessary, allocate more memory */
            if (rem_ == 0)
                alloc_page();

            /* limit this chunk to the space remaining on the current page */
            cur = len;
            if (cur > rem_)
                cur = rem_;

            /* copy it to the page */
            memcpy(wp_, buf, cur);

            /* skip past the space written in the destination */
            ofs_ += cur;
            wp_ += cur;
            rem_ -= cur;

            /* advance past the space in the source */
            buf += cur;
            len -= cur;

        } while (len != 0);
    }
}